

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

void __thiscall AixLog::Filter::add_filter(Filter *this,Severity severity)

{
  mapped_type *pmVar1;
  Tag TStack_48;
  
  Tag::Tag(&TStack_48,"*");
  pmVar1 = std::
           map<AixLog::Tag,_AixLog::Severity,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
           ::operator[](&this->tag_filter_,&TStack_48);
  *pmVar1 = severity;
  Tag::~Tag(&TStack_48);
  return;
}

Assistant:

void add_filter(Severity severity) { tag_filter_["*"] = severity; }